

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_functions.hpp
# Opt level: O2

double WeightedPolynomial<ChebyshevT1WeightFunction>::evaluate
                 (vector<double,_std::allocator<double>_> *c,double x)

{
  double dVar1;
  double dVar2;
  _Vector_base<double,_std::allocator<double>_> local_20;
  
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_20,c);
  dVar1 = Polynomial::evaluate((vector<double,_std::allocator<double>_> *)&local_20,x);
  dVar2 = 1.0 - x * x;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_20);
  return dVar1 * (1.0 / dVar2);
}

Assistant:

static double evaluate( std::vector<double> c, double x ) {
    return Polynomial::evaluate(c,x) * WeightFunctor::evaluate(x);
  }